

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall BindPolymerase::Execute(BindPolymerase *this)

{
  element_type *peVar1;
  SpeciesTracker *pSVar2;
  shared_ptr<Polymerase> new_pol;
  Ptr polymer;
  __shared_ptr<MobileElement,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<Reaction> local_28;
  
  Bind::ChoosePolymer((Bind *)&polymer);
  std::make_shared<Polymerase,Polymerase_const&>((Polymerase *)&new_pol);
  peVar1 = polymer.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<MobileElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymerase,void>
            (local_48,&new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar1->_vptr_Polymer[1])(peVar1,local_48,&(this->super_Bind).promoter_name_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  pSVar2 = SpeciesTracker::Instance();
  std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(polymer.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->wrapper_);
  local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_38._M_ptr)->super_Reaction;
  local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38._M_refcount._M_pi;
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Signal<std::shared_ptr<Reaction>_>::Emit(&pSVar2->propensity_signal_,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  pSVar2 = SpeciesTracker::Instance();
  SpeciesTracker::Increment
            (pSVar2,&((new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     super_MobileElement).name_,-1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&polymer.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void BindPolymerase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Polymerase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
  // Polymer should handle decrementing promoter
  SpeciesTracker::Instance().Increment(new_pol->name(), -1);
}